

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall duckdb::UpdateInfo::Print(UpdateInfo *this)

{
  string sStack_28;
  
  ToString_abi_cxx11_(&sStack_28,this);
  Printer::Print((string *)&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void UpdateInfo::Print() {
	Printer::Print(ToString());
}